

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

ConversionError *
CLI::ConversionError::TooManyInputsFlag(ConversionError *__return_storage_ptr__,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *name_local;
  
  local_18 = name;
  name_local = (string *)__return_storage_ptr__;
  ::std::operator+(&local_38,name,": too many inputs for a flag");
  ConversionError(__return_storage_ptr__,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static ConversionError TooManyInputsFlag(std::string name) {
        return ConversionError(name + ": too many inputs for a flag");
    }